

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O1

void __thiscall
chrono::ChFrameMoving<double>::Compute_Adtdt
          (ChFrameMoving<double> *this,ChMatrix33<double> *mA_dtdt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ChFmMatrix34<double> Fmdt;
  ChFpMatrix34<double> Fpdt;
  ChFmMatrix34<double> Fm;
  ChFpMatrix34<double> Fpdtdt;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_Eigen::Transpose<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_Eigen::Transpose<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>,_0>_>_>_>
  local_208 [16];
  undefined8 local_1f8;
  double *local_1f0;
  double *local_1e8;
  double *local_1e0;
  double *local_1d8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  undefined8 local_1a8;
  double local_1a0;
  undefined8 local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  undefined8 local_170;
  double local_168;
  double local_160;
  double local_158;
  undefined8 local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  undefined8 local_128;
  double local_120;
  undefined8 local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  undefined8 local_e8;
  double local_e0;
  undefined8 local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  undefined8 local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  undefined8 local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  undefined8 local_68;
  double local_60;
  undefined8 local_58;
  double local_50;
  double local_48;
  
  local_a0 = (this->coord_dtdt).rot.m_data[1];
  local_1f0 = &local_a0;
  local_98 = (this->coord_dtdt).rot.m_data[0];
  local_78 = (this->coord_dtdt).rot.m_data[3];
  auVar4._0_8_ = -local_78;
  auVar4._8_4_ = 0;
  auVar4._12_4_ = 0x80000000;
  local_90 = vmovlps_avx(auVar4);
  local_88 = (this->coord_dtdt).rot.m_data[2];
  auVar6._0_8_ = -local_a0;
  auVar6._8_4_ = 0;
  auVar6._12_4_ = 0x80000000;
  local_68 = vmovlps_avx(auVar6);
  auVar2._0_8_ = -local_88;
  auVar2._8_4_ = 0;
  auVar2._12_4_ = 0x80000000;
  local_58 = vmovlps_avx(auVar2);
  local_100 = (this->super_ChFrame<double>).coord.rot.m_data[1];
  local_1e8 = &local_100;
  local_f8 = (this->super_ChFrame<double>).coord.rot.m_data[0];
  local_f0 = (this->super_ChFrame<double>).coord.rot.m_data[3];
  local_e0 = (this->super_ChFrame<double>).coord.rot.m_data[2];
  auVar7._0_8_ = -local_e0;
  auVar7._8_4_ = 0;
  auVar7._12_4_ = 0x80000000;
  local_e8 = vmovlps_avx(auVar7);
  auVar8._0_8_ = -local_f0;
  auVar8._8_4_ = 0;
  auVar8._12_4_ = 0x80000000;
  local_d8 = vmovlps_avx(auVar8);
  auVar1._0_8_ = -local_100;
  auVar1._8_4_ = 0;
  auVar1._12_4_ = 0x80000000;
  local_b0 = vmovlps_avx(auVar1);
  local_1c0 = (this->coord_dt).rot.m_data[1];
  local_1e0 = &local_160;
  local_1b8 = (this->coord_dt).rot.m_data[0];
  local_1b0 = (this->coord_dt).rot.m_data[3];
  auVar5._0_8_ = -local_1b0;
  auVar5._8_4_ = 0;
  auVar5._12_4_ = 0x80000000;
  local_150 = vmovlps_avx(auVar5);
  local_1a0 = (this->coord_dt).rot.m_data[2];
  auVar9._0_8_ = -local_1c0;
  auVar9._8_4_ = 0;
  auVar9._12_4_ = 0x80000000;
  local_128 = vmovlps_avx(auVar9);
  auVar3._0_8_ = -local_1a0;
  auVar3._8_4_ = 0;
  auVar3._12_4_ = 0x80000000;
  local_118 = vmovlps_avx(auVar3);
  local_1d8 = &local_1c0;
  local_1a8 = vmovlps_avx(auVar3);
  local_198 = vmovlps_avx(auVar5);
  local_170 = vmovlps_avx(auVar9);
  local_1f8 = 0x4000000000000000;
  local_190 = local_1b8;
  local_188 = local_1c0;
  local_180 = local_1b0;
  local_178 = local_1a0;
  local_168 = local_1b8;
  local_160 = local_1c0;
  local_158 = local_1b8;
  local_148 = local_1a0;
  local_140 = local_1a0;
  local_138 = local_1b0;
  local_130 = local_1b8;
  local_120 = local_1b0;
  local_110 = local_1c0;
  local_108 = local_1b8;
  local_d0 = local_f8;
  local_c8 = local_100;
  local_c0 = local_f0;
  local_b8 = local_e0;
  local_a8 = local_f8;
  local_80 = local_88;
  local_70 = local_98;
  local_60 = local_78;
  local_50 = local_a0;
  local_48 = local_98;
  ChMatrix33<double>::operator=(mA_dtdt,local_208);
  return;
}

Assistant:

void Compute_Adtdt(ChMatrix33<Real>& mA_dtdt) {
        //  [A_dtdt]=2[Fp(q_dtdt)][Fm(q)]'+2[Fp(q_dt)][Fm(q_dt)]'
        ChFpMatrix34<> Fpdtdt(coord_dtdt.rot);
        ChFmMatrix34<> Fm(this->coord.rot);
        ChFpMatrix34<> Fpdt(coord_dt.rot);
        ChFmMatrix34<> Fmdt(coord_dt.rot);
        mA_dtdt = 2 * (Fpdtdt * Fm.transpose() + Fpdt * Fmdt.transpose());
    }